

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_alloc.c
# Opt level: O0

void small_alloc_large(void)

{
  uint32_t size_min;
  size_t large_size_max;
  size_t large_size_min;
  
  plan(1);
  _space(_stdout);
  printf("# *** %s ***\n","small_alloc_large");
  size_min = mempool_objsize_max((cache.arena)->slab_size);
  small_alloc_test(size_min,(cache.arena)->slab_size << 1,0x32,10,100);
  _ok(1,"true",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/small_alloc.c",0x86,
      "line %d");
  _space(_stdout);
  printf("# *** %s: done ***\n","small_alloc_large");
  check_plan();
  return;
}

Assistant:

static void
small_alloc_large(void)
{
	plan(1);
	header();

	size_t large_size_min = mempool_objsize_max(cache.arena->slab_size);
	size_t large_size_max = 2 * cache.arena->slab_size;
	small_alloc_test(large_size_min, large_size_max, 50, 10, 100);
	ok(true);

	footer();
	check_plan();
}